

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall sorted_ptr_arr<double>::sort(sorted_ptr_arr<double> *this)

{
  ulong local_38;
  size_t i;
  TLeonardoHeap<smoothsort_ptr<double>_> lh;
  sorted_ptr_arr<double> *this_local;
  
  lh._24_8_ = this;
  if (this->ptr_arr != (smoothsort_ptr<double> *)0x0) {
    TLeonardoHeap<smoothsort_ptr<double>_>::TLeonardoHeap
              ((TLeonardoHeap<smoothsort_ptr<double>_> *)&i,this->ptr_arr,this->N);
    for (local_38 = 1; local_38 < this->N - 1; local_38 = local_38 + 1) {
      TLeonardoHeap<smoothsort_ptr<double>_>::dequeue_max
                ((TLeonardoHeap<smoothsort_ptr<double>_> *)&i,this->N - local_38);
    }
    TLeonardoHeap<smoothsort_ptr<double>_>::~TLeonardoHeap
              ((TLeonardoHeap<smoothsort_ptr<double>_> *)&i);
    return;
  }
  __assert_fail("ptr_arr != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gregreen[P]smoothsort/smoothsort.h"
                ,0x159,"void sorted_ptr_arr<double>::sort() [T = double]");
}

Assistant:

void sort() {
		assert(ptr_arr != NULL);	// Something's gone wrong if the program tries to sort without initializing the data
		TLeonardoHeap< smoothsort_ptr<T> > lh(ptr_arr, N);
		for(size_t i=1; i<N-1; i++) { lh.dequeue_max(N-i); }
	}